

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients<int,libdivide::divider<int,(libdivide::Branching)0>>
                   (random_numerators<int> *vals,divider<int,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint64_t uVar4;
  long lVar5;
  byte bVar6;
  uint32_t sign;
  uint uVar7;
  uint32_t mask;
  uint uVar8;
  int iVar9;
  int64_t xl;
  
  uVar4 = 0;
  if ((ulong)vals->_length != 0) {
    iVar2 = (div->div).denom.magic;
    bVar1 = (div->div).denom.more;
    bVar6 = bVar1 & 0x1f;
    uVar7 = (uint)((char)bVar1 >> 7);
    lVar5 = 0;
    uVar8 = 0;
    do {
      uVar3 = *(uint *)((long)vals->_pData + lVar5);
      if (iVar2 == 0) {
        iVar9 = ((int)(((int)uVar3 >> 0x1f & ~(-1 << bVar6)) + uVar3) >> bVar6 ^ uVar7) - uVar7;
      }
      else {
        iVar9 = (uVar3 ^ uVar7) - uVar7;
        if ((bVar1 & 0x40) == 0) {
          iVar9 = 0;
        }
        iVar9 = iVar9 + (int)((ulong)((long)(int)uVar3 * (long)iVar2) >> 0x20);
        iVar9 = (iVar9 >> bVar6) - (iVar9 >> 0x1f);
      }
      uVar8 = uVar8 + iVar9;
      lVar5 = lVar5 + 4;
    } while ((ulong)vals->_length << 2 != lVar5);
    uVar4 = (uint64_t)uVar8;
  }
  return uVar4;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}